

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_engine.cpp
# Opt level: O3

void __thiscall duckdb::RandomEngine::RandomEngine(RandomEngine *this,int64_t seed)

{
  _Head_base<0UL,_duckdb::RandomState_*,_false> _Var1;
  pointer pRVar2;
  unsigned_long uVar3;
  long lVar4;
  pointer *__ptr;
  idx_t random_seed;
  long local_28;
  
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  _Var1._M_head_impl = (RandomState *)operator_new(0x10);
  ((_Var1._M_head_impl)->pcg).super_specific_stream<unsigned_long> = 0x14057b7ef767814f;
  *(unsigned_long *)((long)&(_Var1._M_head_impl)->pcg + 8) = 0x4d595df4d0f33173;
  (this->random_state).
  super_unique_ptr<duckdb::RandomState,_std::default_delete<duckdb::RandomState>_>._M_t.
  super___uniq_ptr_impl<duckdb::RandomState,_std::default_delete<duckdb::RandomState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RandomState_*,_std::default_delete<duckdb::RandomState>_>.
  super__Head_base<0UL,_duckdb::RandomState_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (seed < 0) {
    local_28 = 0;
    lVar4 = syscall(0x13e,&local_28,8,0);
    if ((int)lVar4 == -1) {
      local_28 = ::std::chrono::_V2::system_clock::now();
    }
    pRVar2 = unique_ptr<duckdb::RandomState,_std::default_delete<duckdb::RandomState>,_true>::
             operator->(&this->random_state);
    (pRVar2->pcg).super_specific_stream<unsigned_long>.inc_ = 0x14057b7ef767814f;
    (pRVar2->pcg).state_ = local_28 * 0x5851f42d4c957f2d + 0x1a08ee1184ba6d32;
  }
  else {
    pRVar2 = unique_ptr<duckdb::RandomState,_std::default_delete<duckdb::RandomState>,_true>::
             operator->(&this->random_state);
    uVar3 = NumericCastImpl<unsigned_long,_long,_false>::Convert(seed);
    (pRVar2->pcg).super_specific_stream<unsigned_long>.inc_ = 0x14057b7ef767814f;
    (pRVar2->pcg).state_ = uVar3 * 0x5851f42d4c957f2d + 0x1a08ee1184ba6d32;
  }
  return;
}

Assistant:

RandomEngine::RandomEngine(int64_t seed) : random_state(make_uniq<RandomState>()) {
	if (seed < 0) {
#ifdef __linux__
		idx_t random_seed = 0;
		int result = -1;
#if defined(SYS_getrandom)
		result = static_cast<int>(syscall(SYS_getrandom, &random_seed, sizeof(random_seed), 0));
#endif
		if (result == -1) {
			// Something went wrong with the syscall, we use chrono
			const auto now = std::chrono::high_resolution_clock::now();
			random_seed = now.time_since_epoch().count();
		}
		random_state->pcg.seed(random_seed);
#else
		random_state->pcg.seed(pcg_extras::seed_seq_from<std::random_device>());
#endif
	} else {
		random_state->pcg.seed(NumericCast<uint64_t>(seed));
	}
}